

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IBMPC.cpp
# Opt level: O2

int GetUnformatSizeCode(DataRate datarate)

{
  int iVar1;
  
  iVar1 = 6;
  if ((datarate != _250K) && (datarate != _300K)) {
    if (datarate == _1M) {
      return 8;
    }
    iVar1 = 7;
  }
  return iVar1;
}

Assistant:

int GetUnformatSizeCode(DataRate datarate)
{
    switch (datarate)
    {
    case DataRate::_250K:   return 6;
    case DataRate::_300K:   return 6;
    case DataRate::_500K:   return 7;
    case DataRate::_1M:     return 8;
    default:                break;
    }

    return 7;
}